

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddDeferredStubs
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,
          DeferredFunctionStub *deferredStubs,uint stubsCount,ByteCodeCache *cache,bool recursive)

{
  DeferredFunctionStub *value;
  uint32 uVar1;
  BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *dictionary;
  Ident *pIVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int value_00;
  undefined4 *puVar6;
  Recycler *this_00;
  int *piVar7;
  EntryType *pEVar8;
  ByteBuffer *bb;
  ulong uVar9;
  uint value_01;
  uint uVar10;
  undefined1 local_c0 [8];
  EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  TrackAllocData data;
  
  if (stubsCount == 0 || deferredStubs != (DeferredFunctionStub *)0x0) {
    if (stubsCount != 0 && deferredStubs != (DeferredFunctionStub *)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar9 = 0;
      do {
        value = deferredStubs + uVar9;
        PrependInt32(this,builder,L"Character Min",deferredStubs[uVar9].ichMin,
                     (BufferBuilderInt32 **)0x0);
        PrependInt32(this,builder,L"Function flags",deferredStubs[uVar9].fncFlags,
                     (BufferBuilderInt32 **)0x0);
        PrependStruct<RestorePoint>(this,builder,L"Restore Point",&value->restorePoint);
        dictionary = deferredStubs[uVar9].capturedNamePointers.ptr;
        if ((dictionary ==
             (BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)0x0) ||
           (value_01 = (dictionary->
                       super_BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ).count - (dictionary->
                                 super_BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                 ).freeCount, value_01 == 0)) {
          PrependInt32(this,builder,L"Captured Name Count",0,(BufferBuilderInt32 **)0x0);
        }
        else {
          JsUtil::
          BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_c0,dictionary);
          PrependInt32(this,builder,L"Captured Name Count",value_01,(BufferBuilderInt32 **)0x0);
          if (cache != (ByteCodeCache *)0x0) {
            value->capturedNameCount = value_01;
            iter.
            super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
            ._24_8_ = &int::typeinfo;
            this_00 = Memory::Recycler::TrackAllocInfo
                                (this->scriptContext->recycler,
                                 (TrackAllocData *)
                                 &iter.
                                  super_IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                  .usedEntryCount);
            BVar5 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar5 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                          ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                          "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar4) goto LAB_00872a91;
              *puVar6 = 0;
            }
            piVar7 = (int *)Memory::Recycler::
                            AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                                      (this_00,(ulong)value_01 << 2);
            if (piVar7 == (int *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                          ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar4) goto LAB_00872a91;
              *puVar6 = 0;
            }
            Memory::Recycler::WBSetBit((char *)&value->capturedNameSerializedIds);
            (value->capturedNameSerializedIds).ptr = piVar7;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&value->capturedNameSerializedIds);
            Memory::Recycler::WBSetBit((char *)&value->byteCodeCache);
            (value->byteCodeCache).ptr = cache;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&value->byteCodeCache);
          }
          bVar4 = JsUtil::
                  BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::
                  EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  ::IsValid((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                             *)local_c0);
          if (bVar4) {
            uVar10 = 0;
            do {
              pEVar8 = JsUtil::
                       BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ::
                       IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                       ::Current((IteratorBase<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                  *)local_c0);
              pIVar2 = (pEVar8->
                       super_DefaultHashedEntry<Ident_*,_Ident_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                       ).super_ImplicitKeyValueEntry<Ident_*,_Ident_*>.
                       super_ValueEntry<Ident_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Ident_*>_>
                       .super_ValueEntryData<Ident_*>.value;
              uVar1 = pIVar2->m_cch;
              bb = (ByteBuffer *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
              bb->byteCount = uVar1 * 2 + 2;
              (bb->field_1).pv = &pIVar2->field_0x22;
              value_00 = GetString16Id(this,bb,false);
              if (cache != (ByteCodeCache *)0x0) {
                if (value_01 <= uVar10) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar6 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                              ,0xa37,"(j < capturedNamesCount)",
                                              "j < capturedNamesCount");
                  if (!bVar4) goto LAB_00872a91;
                  *puVar6 = 0;
                }
                (value->capturedNameSerializedIds).ptr[uVar10] = value_00;
              }
              PrependInt32(this,builder,L"Captured Name",value_00,(BufferBuilderInt32 **)0x0);
              JsUtil::
              BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                          *)local_c0);
              uVar10 = uVar10 + 1;
              bVar4 = JsUtil::
                      BaseDictionary<Ident_*,_Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      ::
                      EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                      ::IsValid((EntryIterator<JsUtil::BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                                 *)local_c0);
            } while (bVar4);
          }
        }
        PrependInt32(this,builder,L"Nested Count",value->nestedCount,(BufferBuilderInt32 **)0x0);
        if (recursive) {
          AddDeferredStubs(this,builder,(value->deferredStubs).ptr,value->nestedCount,cache,true);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != stubsCount);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xa0c,"(!(deferredStubs == nullptr && stubsCount > 0))",
                                "!(deferredStubs == nullptr && stubsCount > 0)");
    if (!bVar4) {
LAB_00872a91:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return 0;
}

Assistant:

HRESULT AddDeferredStubs(BufferBuilderList & builder, DeferredFunctionStub* deferredStubs, uint stubsCount, ByteCodeCache* cache, bool recursive)
    {
        AssertOrFailFast(!(deferredStubs == nullptr && stubsCount > 0));

        if (deferredStubs == nullptr || stubsCount == 0)
        {
            return S_OK;
        }

        for (uint i = 0; i < stubsCount; i++)
        {
            DeferredFunctionStub* currentStub = deferredStubs + i;

            PrependUInt32(builder, _u("Character Min"), currentStub->ichMin);
            PrependUInt32(builder, _u("Function flags"), currentStub->fncFlags);
            PrependStruct(builder, _u("Restore Point"), &(currentStub->restorePoint));

            // Add all the captured name ids
            IdentPtrSet *capturedNames = currentStub->capturedNamePointers;

            if (capturedNames != nullptr && capturedNames->Count() != 0)
            {
                uint capturedNamesCount = capturedNames->Count();
                auto iter = capturedNames->GetIterator();

                PrependUInt32(builder, _u("Captured Name Count"), capturedNamesCount);

                if (cache != nullptr)
                {
                    currentStub->capturedNameCount = capturedNamesCount;
                    currentStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, capturedNamesCount);
                    currentStub->byteCodeCache = cache;
                }

                uint j = 0;
                while (iter.IsValid())
                {
                    // The captured names are IdentPtr allocated in Parser arena memory.
                    // We have to convert them to indices into our string table to effectively
                    // serialize the names.
                    const IdentPtr& pid = iter.CurrentValueReference();
                    int capturedNameSerializedId = this->GetIdOfString(pid->Psz(), (pid->Cch() + 1) * sizeof(WCHAR));

                    if (cache != nullptr)
                    {
                        Assert(j < capturedNamesCount);
                        currentStub->capturedNameSerializedIds[j] = capturedNameSerializedId;
                    }

                    PrependInt32(builder, _u("Captured Name"), capturedNameSerializedId);

                    iter.MoveNext();
                    j++;
                }
            }
            else
            {
                PrependUInt32(builder, _u("Captured Name Count"), 0);
            }

            PrependUInt32(builder, _u("Nested Count"), currentStub->nestedCount);
            if (recursive)
            {
                AddDeferredStubs(builder, currentStub->deferredStubs, currentStub->nestedCount, cache, recursive);
            }
        }

        return S_OK;
    }